

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_url.c
# Opt level: O0

char find_delim(char **pp,int colon_and_at_sign_are_delims)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  undefined8 *in_RDI;
  int res;
  int chars;
  uint val;
  char ch;
  char *to;
  char *from;
  int local_34;
  undefined1 local_30 [7];
  char local_29;
  char *local_28;
  char *local_20;
  int local_14;
  undefined8 *local_10;
  
  local_28 = (char *)*in_RDI;
  local_20 = (char *)*in_RDI;
  local_14 = in_ESI;
  local_10 = in_RDI;
  while( true ) {
    pcVar2 = local_20 + 1;
    local_29 = *local_20;
    if ((local_29 == '\0') || (local_29 == '#')) break;
    local_20 = pcVar2;
    if (local_29 == '%') {
      iVar1 = __isoc99_sscanf(pcVar2,"%2x%n",local_30,&local_34);
      if (((iVar1 == -1) || (iVar1 < 1)) || (local_34 != 2)) {
        return '%';
      }
      *local_28 = (char)local_30._0_4_;
      local_20 = local_20 + 2;
      local_28 = local_28 + 1;
    }
    else {
      if (local_29 == '/') break;
      if (local_29 == ':') {
LAB_0011658c:
        if (local_14 != 0) break;
        *local_28 = local_29;
        local_28 = local_28 + 1;
      }
      else {
        if (local_29 == '?') break;
        if (local_29 == '@') goto LAB_0011658c;
        if ((local_29 == '[') || (local_29 == ']')) break;
        *local_28 = local_29;
        local_28 = local_28 + 1;
      }
    }
  }
  *local_28 = '\0';
  *local_10 = pcVar2;
  return local_29;
}

Assistant:

static char find_delim(char **pp, int colon_and_at_sign_are_delims)
{
  char *from = *pp;
  char *to = from;

  for (;;) {
    char ch = *from++;

    switch (ch) {
    case ':':
    case '@':
      if (!colon_and_at_sign_are_delims) {
        *to++ = ch;
        break;
      }

      /* fall through */
    case 0:
    case '/':
    case '?':
    case '#':
    case '[':
    case ']':
      *to = 0;
      *pp = from;
      return ch;

    case '%': {
      unsigned int val;
      int chars;
      int res = sscanf(from, "%2x%n", &val, &chars);

      if (res == EOF || res < 1 || chars != 2)
        /* Return a surprising delimiter to
           force an error. */
      {
        return '%';
      }

      *to++ = val;
      from += 2;
      break;
    }

    default:
      *to++ = ch;
      break;
    }
  }
}